

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

complex<double> __thiscall soul::Value::PackedData::getAs<std::complex<double>>(PackedData *this)

{
  complex<double> cVar1;
  PackedData *this_local;
  
  checkAssertion(this->size == 0x10,"size == sizeof (Primitive)","getAs",0x15e);
  cVar1 = readUnaligned<std::complex<double>>(this->data);
  return (complex<double>)cVar1._M_value;
}

Assistant:

Primitive getAs() const                 { SOUL_ASSERT (size == sizeof (Primitive)); return readUnaligned<Primitive> (data); }